

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::copy_xpath_variable(xpath_variable *lhs,xpath_variable *rhs)

{
  xpath_value_type xVar1;
  xpath_variable *rhs_local;
  xpath_variable *lhs_local;
  
  xVar1 = xpath_variable::type(rhs);
  switch(xVar1) {
  case xpath_type_node_set:
    lhs_local._7_1_ = xpath_variable::set(lhs,(xpath_node_set *)(rhs + 1));
    break;
  case xpath_type_number:
    lhs_local._7_1_ = xpath_variable::set(lhs,*(double *)(rhs + 1));
    break;
  case xpath_type_string:
    lhs_local._7_1_ = xpath_variable::set(lhs,*(char_t **)(rhs + 1));
    break;
  case xpath_type_boolean:
    lhs_local._7_1_ = xpath_variable::set(lhs,(bool)((char)rhs[1]._type & xpath_type_node_set));
    break;
  default:
    __assert_fail("false && \"Invalid variable type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x2338,
                  "bool pugi::impl::(anonymous namespace)::copy_xpath_variable(xpath_variable *, const xpath_variable *)"
                 );
  }
  return lhs_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool copy_xpath_variable(xpath_variable* lhs, const xpath_variable* rhs)
	{
		switch (rhs->type())
		{
		case xpath_type_node_set:
			return lhs->set(static_cast<const xpath_variable_node_set*>(rhs)->value);

		case xpath_type_number:
			return lhs->set(static_cast<const xpath_variable_number*>(rhs)->value);

		case xpath_type_string:
			return lhs->set(static_cast<const xpath_variable_string*>(rhs)->value);

		case xpath_type_boolean:
			return lhs->set(static_cast<const xpath_variable_boolean*>(rhs)->value);

		default:
			assert(false && "Invalid variable type"); // unreachable
			return false;
		}
	}